

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O0

bool imports_util::isNameValid(Executable *pe,char *myName)

{
  bufsize_t __s;
  size_t sVar1;
  allocator<char> local_51;
  string local_50;
  undefined1 local_29;
  bufsize_t bStack_28;
  bool isInvalid;
  bufsize_t upperLimit;
  char *myName_local;
  Executable *pe_local;
  
  if (myName == (char *)0x0) {
    pe_local._7_1_ = false;
  }
  else {
    upperLimit = (bufsize_t)myName;
    myName_local = (char *)pe;
    bStack_28 = AbstractByteBuffer::getMaxSizeFromPtr(&pe->super_AbstractByteBuffer,(BYTE *)myName);
    if (bStack_28 == 0) {
      pe_local._7_1_ = false;
    }
    else {
      local_29 = pe_util::hasNonPrintable((char *)upperLimit,bStack_28);
      __s = upperLimit;
      if ((bool)local_29) {
        pe_local._7_1_ = false;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,(char *)__s,&local_51);
        sVar1 = pe_util::noWhiteCount(&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator(&local_51);
        if (sVar1 == 0) {
          pe_local._7_1_ = false;
        }
        else {
          pe_local._7_1_ = true;
        }
      }
    }
  }
  return pe_local._7_1_;
}

Assistant:

bool imports_util::isNameValid(Executable *pe, char* myName)
{
    if (!myName) return false; // do not parse, invalid entry
    bufsize_t upperLimit = pe->getMaxSizeFromPtr((BYTE*) myName);
    if (upperLimit == 0) return false;

    bool isInvalid = pe_util::hasNonPrintable(myName, upperLimit);
    if (isInvalid) return false;
    if (pe_util::noWhiteCount(myName) == 0) return false;

    return true;
}